

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O0

ZCC_OpProto * __thiscall
ZCC_OpInfoType::FindBestProto(ZCC_OpInfoType *this,PType *optype,Conversion **route,int *numslots)

{
  int iVar1;
  ZCC_OpProto *pZStack_d0;
  int dist;
  ZCC_OpProto *proto;
  ZCC_OpProto *pZStack_c0;
  int best_dist;
  ZCC_OpProto *best_proto;
  Conversion **ppCStack_b0;
  int cur_route;
  Conversion **best_route;
  Conversion *routes [2] [8];
  int *numslots_local;
  Conversion **route_local;
  PType *optype_local;
  ZCC_OpInfoType *this_local;
  
  routes[1][7] = (Conversion *)numslots;
  if (optype != (PType *)0x0) {
    ppCStack_b0 = (Conversion **)0x0;
    best_proto._4_4_ = 0;
    pZStack_c0 = (ZCC_OpProto *)0x0;
    proto._4_4_ = 0x7fffffff;
    for (pZStack_d0 = this->Protos; proto._4_4_ != 0 && pZStack_d0 != (ZCC_OpProto *)0x0;
        pZStack_d0 = pZStack_d0->Next) {
      if (((pZStack_d0->Type2 == (PType *)0x0) &&
          (iVar1 = PType::FindConversion
                             (optype,pZStack_d0->Type1,routes[(long)(int)best_proto._4_4_ + -1] + 7,
                              8), -1 < iVar1)) && (iVar1 < proto._4_4_)) {
        pZStack_c0 = pZStack_d0;
        ppCStack_b0 = routes[(long)(int)best_proto._4_4_ + -1] + 7;
        best_proto._4_4_ = best_proto._4_4_ ^ 1;
        proto._4_4_ = iVar1;
      }
    }
    if (((ppCStack_b0 != (Conversion **)0x0) && (route != (Conversion **)0x0)) &&
       (0 < *(int *)&routes[1][7]->TargetType)) {
      iVar1 = MIN<int>(*(int *)&routes[1][7]->TargetType,proto._4_4_);
      *(int *)&routes[1][7]->TargetType = iVar1;
      if (0 < *(int *)&routes[1][7]->TargetType) {
        memcpy(route,ppCStack_b0,(long)*(int *)&routes[1][7]->TargetType << 3);
      }
    }
    return pZStack_c0;
  }
  __assert_fail("optype != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_expr.cpp"
                ,0x79,
                "ZCC_OpProto *ZCC_OpInfoType::FindBestProto(PType *, const PType::Conversion **, int &)"
               );
}

Assistant:

ZCC_OpProto *ZCC_OpInfoType::FindBestProto(PType *optype, const PType::Conversion **route, int &numslots)
{
	assert(optype != NULL);

	const PType::Conversion *routes[2][CONVERSION_ROUTE_SIZE];
	const PType::Conversion **best_route = NULL;
	int cur_route = 0;
	ZCC_OpProto *best_proto = NULL;
	int best_dist = INT_MAX;

	// Find the best prototype.
	for (ZCC_OpProto *proto = Protos; best_dist != 0 && proto != NULL; proto = proto->Next)
	{
		if (proto->Type2 != NULL)
		{ // Not a unary prototype.
			continue;
		}
		int dist = optype->FindConversion(proto->Type1, routes[cur_route], CONVERSION_ROUTE_SIZE);
		if (dist >= 0 && dist < best_dist)
		{
			best_dist = dist;
			best_proto = proto;
			best_route = routes[cur_route];
			cur_route ^= 1;
		}
	}
	// Copy best conversion route to the caller's array.
	if (best_route != NULL && route != NULL && numslots > 0)
	{
		numslots = MIN(numslots, best_dist);
		if (numslots > 0)
		{
			memcpy(route, best_route, sizeof(*route) * numslots);
		}
	}
	return best_proto;
}